

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BriefOperator.cpp
# Opt level: O2

void __thiscall lts2::BriefOperator::initWithPatchSize(BriefOperator *this,Size *patchSize)

{
  uint uVar1;
  BasisFunction *pBVar2;
  IntegratingCell *pIVar3;
  ostream *poVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  ulong uVar12;
  uint uVar13;
  Size local_38;
  
  local_38 = *patchSize;
  LBDOperator::setPatchSize(&this->super_LBDOperator,&local_38);
  pIVar3 = (this->super_LBDOperator)._sensitiveCells;
  if (pIVar3 != (IntegratingCell *)0x0) {
    operator_delete__(pIVar3);
  }
  uVar7 = patchSize->width - 9;
  uVar13 = patchSize->height - 9;
  (this->super_LBDOperator)._patternPoints = uVar13 * uVar7;
  pIVar3 = (IntegratingCell *)
           operator_new__((ulong)(uint)(*(int *)&(this->super_LBDOperator).super_LinearOperator.
                                                 field_0xc * 2) * 0x18);
  (this->super_LBDOperator)._sensitiveCells = pIVar3;
  poVar4 = std::operator<<((ostream *)&std::cerr,"Generating ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," pairs.\n");
  uVar1 = *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
  pBVar2 = (this->super_LBDOperator)._basisFunctions;
  pdVar11 = &(this->super_LBDOperator)._sensitiveCells[1].scaleFactor;
  uVar5 = 0x2a;
  uVar6 = 1;
  for (uVar12 = 0; uVar12 < uVar1; uVar12 = uVar12 + 1) {
    iVar9 = 0;
    if (uVar7 == 0) {
      iVar10 = 0;
    }
    else {
      uVar5 = (uVar5 >> 0x20) + (uVar5 & 0xffffffff) * 0xf83f630a;
      iVar10 = (int)((uVar5 & 0xffffffff) % (ulong)uVar7);
    }
    if (uVar13 != 0) {
      uVar5 = (uVar5 >> 0x20) + (uVar5 & 0xffffffff) * 0xf83f630a;
      iVar9 = (int)((uVar5 & 0xffffffff) % (ulong)uVar13);
    }
    iVar8 = 0;
    *(int *)(pdVar11 + -5) = iVar10;
    *(int *)(pdVar11 + -4) = iVar9;
    *(int *)((long)pdVar11 + -0x24) = iVar10 + 9;
    *(int *)((long)pdVar11 + -0x1c) = iVar9 + 9;
    pdVar11[-3] = 0.012345679012345678;
    if (uVar7 == 0) {
      iVar9 = 0;
    }
    else {
      uVar5 = (uVar5 >> 0x20) + (uVar5 & 0xffffffff) * 0xf83f630a;
      iVar9 = (int)((uVar5 & 0xffffffff) % (ulong)uVar7);
    }
    if (uVar13 != 0) {
      uVar5 = (uVar5 >> 0x20) + (uVar5 & 0xffffffff) * 0xf83f630a;
      iVar8 = (int)((uVar5 & 0xffffffff) % (ulong)uVar13);
    }
    ((IntegratingCell *)(pdVar11 + -2))->xmin = iVar9;
    *(int *)(pdVar11 + -1) = iVar8;
    *(int *)((long)pdVar11 + -0xc) = iVar9 + 9;
    *(int *)((long)pdVar11 + -4) = iVar8 + 9;
    *pdVar11 = 0.012345679012345678;
    pBVar2[uVar12].pos_cell = uVar6 - 1;
    pBVar2[uVar12].neg_cell = uVar6;
    pdVar11 = pdVar11 + 6;
    uVar6 = uVar6 + 2;
  }
  std::operator<<((ostream *)&std::cerr,"Done !\n");
  return;
}

Assistant:

void lts2::BriefOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);

    cv::RNG rng(42);

    // Only 9x9 patches (except borders)
    int const detectorRadius = 9 / 2;

    // Reset
    if (_sensitiveCells)
      delete[] _sensitiveCells;

    // Points where we can have a sensitive cell
    int usefulWidth = patchSize.width - 9;
    int usefulHeight = patchSize.height - 9;
    _patternPoints = usefulWidth*usefulHeight;
    _sensitiveCells = new lbd::IntegratingCell[2*_pairsInUse];

    double invCellArea = 1.0/81.0;

    std::cerr << "Generating " << _pairsInUse << " pairs.\n";

    for (int i = 0; i < _pairsInUse; ++i)
    {
      unsigned int x_pos = rng(usefulWidth);
      unsigned int y_pos = rng(usefulHeight);

      _sensitiveCells[2*i].xmin = x_pos;
      _sensitiveCells[2*i].ymin = y_pos;
      _sensitiveCells[2*i].xmax = x_pos + 9;
      _sensitiveCells[2*i].ymax = y_pos + 9;
      _sensitiveCells[2*i].scaleFactor = invCellArea;

      unsigned int x_neg = rng(usefulWidth);
      unsigned int y_neg = rng(usefulHeight);

      _sensitiveCells[2*i+1].xmin = x_neg;
      _sensitiveCells[2*i+1].ymin = y_neg;
      _sensitiveCells[2*i+1].xmax = x_neg + 9;
      _sensitiveCells[2*i+1].ymax = y_neg + 9;
      _sensitiveCells[2*i+1].scaleFactor = invCellArea;

      _basisFunctions[i].pos_cell = 2*i;
      _basisFunctions[i].neg_cell = 2*i+1;
    }
    std::cerr << "Done !\n";
}